

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttbdf.c
# Opt level: O1

FT_Error tt_face_find_bdf_prop(TT_Face face,char *property_name,BDF_PropertyRec *aprop)

{
  TT_BDFRec *pbytes;
  FT_Size pFVar1;
  FT_Stream stream;
  bool bVar2;
  bool bVar3;
  FT_Error FVar4;
  int iVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  ushort *puVar9;
  ushort uVar10;
  ulong uVar11;
  uint *puVar12;
  char cVar13;
  uint uVar14;
  ushort *puVar15;
  ulong uVar16;
  ushort uVar17;
  ushort uVar18;
  long lVar19;
  ushort *puVar20;
  FT_UInt FVar21;
  uint uVar22;
  TT_BDF bdf;
  byte bVar23;
  FT_Byte *pFVar24;
  FT_ULong length;
  ulong local_38;
  
  pbytes = &face->bdf;
  pFVar1 = (face->root).size;
  aprop->type = BDF_PROPERTY_TYPE_NONE;
  if ((face->bdf).loaded != '\0') goto LAB_0024fe14;
  stream = (face->root).stream;
  (face->bdf).strings = (FT_Byte *)0x0;
  (face->bdf).strings_size = 0;
  pbytes->table = (FT_Byte *)0x0;
  (face->bdf).table_end = (FT_Byte *)0x0;
  (face->bdf).num_strikes = 0;
  (face->bdf).loaded = '\0';
  *(undefined3 *)&(face->bdf).field_0x25 = 0;
  FVar4 = tt_face_goto_table(face,0x42444620,stream,&local_38);
  uVar22 = 8;
  if (local_38 < 8 || FVar4 != 0) {
    puVar20 = (ushort *)0x0;
  }
  else {
    uVar22 = 8;
    FVar4 = FT_Stream_ExtractFrame(stream,local_38,&pbytes->table);
    if (FVar4 == 0) {
      puVar20 = (ushort *)(face->bdf).table;
      (face->bdf).table_end = (FT_Byte *)((long)puVar20 + local_38);
      cVar13 = '\x03';
      if ((ushort)(*puVar20 << 8 | *puVar20 >> 8) == 1) {
        uVar14 = *(uint *)(puVar20 + 2);
        uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18
        ;
        uVar8 = (ulong)uVar14;
        if (7 < uVar14) {
          uVar10 = puVar20[1] << 8 | puVar20[1] >> 8;
          uVar11 = (ulong)uVar10;
          uVar22 = (uint)uVar10;
          if ((uVar8 <= local_38 && local_38 - uVar8 != 0) && uVar11 <= uVar8 - 8 >> 2) {
            (face->bdf).num_strikes = (uint)uVar10;
            puVar9 = (ushort *)(uVar8 + (long)puVar20);
            (face->bdf).strings = (FT_Byte *)puVar9;
            (face->bdf).strings_size = local_38 - uVar8;
            puVar15 = puVar20 + uVar11 * 2 + 4;
            if (uVar10 != 0) {
              lVar19 = 0;
              do {
                uVar8 = (ulong)(ushort)(puVar20[lVar19 * 2 + 5] << 8 | puVar20[lVar19 * 2 + 5] >> 8)
                ;
                uVar11 = uVar8 * 5;
                puVar15 = puVar15 + uVar8 * 5;
                lVar19 = lVar19 + 1;
              } while ((uint)uVar10 != (uint)lVar19);
            }
            uVar22 = (uint)uVar11;
            puVar20 = (ushort *)(ulong)(puVar9 < puVar15);
            cVar13 = (puVar9 < puVar15) * '\x03';
          }
        }
      }
      if (cVar13 != '\x03') {
        if (cVar13 == '\0') {
          (face->bdf).loaded = '\x01';
          uVar22 = 0;
          puVar20 = (ushort *)&DAT_00000001;
        }
        goto LAB_0024fe0c;
      }
      FT_Stream_ReleaseFrame(stream,&pbytes->table);
      (face->bdf).strings = (FT_Byte *)0x0;
      (face->bdf).strings_size = 0;
      pbytes->table = (FT_Byte *)0x0;
      (face->bdf).table_end = (FT_Byte *)0x0;
      (face->bdf).num_strikes = 0;
      (face->bdf).loaded = '\0';
      *(undefined3 *)&(face->bdf).field_0x25 = 0;
    }
    puVar20 = (ushort *)0x0;
    uVar22 = 8;
  }
LAB_0024fe0c:
  if (((ulong)puVar20 & 1) == 0) {
    return uVar22;
  }
LAB_0024fe14:
  if (property_name != (char *)0x0 && pFVar1 != (FT_Size)0x0) {
    FVar21 = (face->bdf).num_strikes;
    sVar6 = strlen(property_name);
    if (FVar21 != 0 && sVar6 != 0) {
      puVar12 = (uint *)(pbytes->table + (ulong)(FVar21 << 2) + 8);
      puVar20 = (ushort *)(pbytes->table + 8);
      uVar10 = (pFVar1->metrics).y_ppem;
      do {
        uVar17 = *puVar20 << 8 | *puVar20 >> 8;
        uVar18 = puVar20[1] << 8 | puVar20[1] >> 8;
        uVar8 = (ulong)(((uint)uVar18 + (uint)uVar18) * 5);
        if (uVar17 == uVar10) {
          uVar8 = 0;
        }
        puVar12 = (uint *)(uVar8 + (long)puVar12);
        uVar22 = (uint)uVar18;
        if (uVar17 == uVar10) {
          FVar4 = 6;
          goto joined_r0x0024fedf;
        }
        puVar20 = puVar20 + 2;
        FVar21 = FVar21 - 1;
      } while (FVar21 != 0);
    }
  }
  return 6;
joined_r0x0024fedf:
  if (uVar22 == 0) {
    return FVar4;
  }
  uVar22 = uVar22 - 1;
  bVar23 = *(byte *)((long)puVar12 + 5);
  if ((bVar23 & 0x10) == 0) {
LAB_00250017:
    puVar12 = (uint *)((long)puVar12 + 10);
    bVar3 = false;
  }
  else {
    uVar14 = *puVar12;
    uVar16 = (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                    uVar14 << 0x18);
    uVar8 = (face->bdf).strings_size;
    bVar3 = false;
    bVar2 = true;
    uVar11 = uVar8 - uVar16;
    if ((uVar16 <= uVar8 && uVar11 != 0) && (sVar6 < uVar11)) {
      uVar14 = *(uint *)((long)puVar12 + 6);
      pFVar24 = (face->bdf).strings;
      iVar5 = strncmp(property_name,(char *)(pFVar24 + uVar16),uVar11);
      if (iVar5 == 0) {
        uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18
        ;
        bVar23 = bVar23 & 0xf;
        bVar3 = false;
        if (bVar23 < 2) {
          bVar2 = true;
          if (uVar14 < uVar8) {
            pFVar24 = pFVar24 + uVar14;
            pvVar7 = memchr(pFVar24,0,uVar8);
            bVar3 = false;
            if (pvVar7 != (void *)0x0) {
              aprop->type = BDF_PROPERTY_TYPE_ATOM;
              (aprop->u).atom = (char *)pFVar24;
              goto LAB_0024fff5;
            }
          }
        }
        else {
          bVar2 = true;
          if (bVar23 == 2) {
            aprop->type = BDF_PROPERTY_TYPE_INTEGER;
          }
          else {
            if (bVar23 != 3) goto LAB_00250012;
            aprop->type = BDF_PROPERTY_TYPE_CARDINAL;
          }
          (aprop->u).cardinal = uVar14;
LAB_0024fff5:
          bVar2 = false;
          FVar4 = 0;
          bVar3 = true;
        }
      }
      else {
        bVar2 = true;
      }
    }
LAB_00250012:
    if (bVar2) goto LAB_00250017;
  }
  if (bVar3) {
    return FVar4;
  }
  goto joined_r0x0024fedf;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_find_bdf_prop( TT_Face           face,
                         const char*       property_name,
                         BDF_PropertyRec  *aprop )
  {
    TT_BDF     bdf   = &face->bdf;
    FT_Size    size  = FT_FACE( face )->size;
    FT_Error   error = FT_Err_Ok;
    FT_Byte*   p;
    FT_UInt    count;
    FT_Byte*   strike;
    FT_Offset  property_len;


    aprop->type = BDF_PROPERTY_TYPE_NONE;

    if ( bdf->loaded == 0 )
    {
      error = tt_face_load_bdf_props( face, FT_FACE( face )->stream );
      if ( error )
        goto Exit;
    }

    count  = bdf->num_strikes;
    p      = bdf->table + 8;
    strike = p + 4 * count;

    error = FT_ERR( Invalid_Argument );

    if ( !size || !property_name )
      goto Exit;

    property_len = ft_strlen( property_name );
    if ( property_len == 0 )
      goto Exit;

    for ( ; count > 0; count-- )
    {
      FT_UInt  _ppem  = FT_NEXT_USHORT( p );
      FT_UInt  _count = FT_NEXT_USHORT( p );


      if ( _ppem == size->metrics.y_ppem )
      {
        count = _count;
        goto FoundStrike;
      }

      strike += 10 * _count;
    }
    goto Exit;

  FoundStrike:
    p = strike;
    for ( ; count > 0; count-- )
    {
      FT_UInt  type = FT_PEEK_USHORT( p + 4 );


      if ( ( type & 0x10 ) != 0 )
      {
        FT_UInt32  name_offset = FT_PEEK_ULONG( p     );
        FT_UInt32  value       = FT_PEEK_ULONG( p + 6 );

        /* be a bit paranoid for invalid entries here */
        if ( name_offset < bdf->strings_size                    &&
             property_len < bdf->strings_size - name_offset     &&
             ft_strncmp( property_name,
                         (const char*)bdf->strings + name_offset,
                         bdf->strings_size - name_offset ) == 0 )
        {
          switch ( type & 0x0F )
          {
          case 0x00:  /* string */
          case 0x01:  /* atoms */
            /* check that the content is really 0-terminated */
            if ( value < bdf->strings_size &&
                 ft_memchr( bdf->strings + value, 0, bdf->strings_size ) )
            {
              aprop->type   = BDF_PROPERTY_TYPE_ATOM;
              aprop->u.atom = (const char*)bdf->strings + value;
              error         = FT_Err_Ok;
              goto Exit;
            }
            break;

          case 0x02:
            aprop->type      = BDF_PROPERTY_TYPE_INTEGER;
            aprop->u.integer = (FT_Int32)value;
            error            = FT_Err_Ok;
            goto Exit;

          case 0x03:
            aprop->type       = BDF_PROPERTY_TYPE_CARDINAL;
            aprop->u.cardinal = value;
            error             = FT_Err_Ok;
            goto Exit;

          default:
            ;
          }
        }
      }
      p += 10;
    }

  Exit:
    return error;
  }